

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Connection::onDataAvailable(Connection *this,SharedPtr *client,Buffer *buf)

{
  Buffers *this_00;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  ulong uVar5;
  size_t in_RCX;
  int __fd;
  __shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *this_01;
  Log *stream;
  uint uVar7;
  shared_ptr<Message> message;
  shared_ptr<Connection> that;
  Log local_40d0;
  MessageError error;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_4078;
  undefined1 local_4068 [16];
  undefined1 local_4058 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4048;
  StackBuffer<16384UL,_char> buffer;
  SharedPtr *pSVar6;
  
  this_00 = &this->mBuffers;
  do {
    this_01 = (__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> *)&that;
    if (buf->bufferSize != 0) {
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::push_back
                ((list<Buffer,_std::allocator<Buffer>_> *)this_00,buf);
    }
    sVar3 = Buffers::size(this_00);
    uVar7 = (uint)sVar3;
    if (uVar7 == 0) {
      return;
    }
    uVar2 = this->mPendingRead;
    if (uVar2 == 0) {
      if (uVar7 < 4) {
        return;
      }
      sVar4 = Buffers::read(this_00,(int)&buffer,(void *)0x4,in_RCX);
      if ((int)sVar4 != 4) {
        __assert_fail("read == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x83,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      this->mPendingRead = buffer.mStackBuffer._0_4_;
      if ((int)buffer.mStackBuffer._0_4_ < 1) {
        __assert_fail("mPendingRead > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x85,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      uVar7 = uVar7 - 4;
      uVar2 = buffer.mStackBuffer._0_4_;
    }
    else if ((int)uVar2 < 0) {
      __assert_fail("mPendingRead >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x88,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    if (uVar7 < uVar2) {
      return;
    }
    StackBuffer<16384UL,_char>::StackBuffer(&buffer,(ulong)uVar2);
    uVar5 = Buffers::read(this_00,(int)buffer.mBuffer,(void *)(long)this->mPendingRead,in_RCX);
    if (this->mPendingRead != (int)uVar5) {
      __assert_fail("read == mPendingRead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x8e,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    this->mPendingRead = 0;
    error.type = Message_Success;
    error.text.mString._M_dataplus._M_p = (pointer)&error.text.mString.field_2;
    error.text.mString._M_string_length = 0;
    error.text.mString.field_2._M_local_buf[0] = '\0';
    in_RCX = uVar5 & 0xffffffff;
    Message::create((Message *)&message,this->mVersion,buffer.mBuffer,(int)uVar5,&error);
    if (message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if ((this->mErrorHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_4058._0_8_ = 1;
        Log::Log((Log *)&local_4078,LogLevel::Error,(Flags<LogOutput::LogFlag> *)local_4058);
        Log::operator<<(&local_40d0,(char *)&local_4078);
        Log::addStringStream<int>((Log *)local_4068,(int)&local_40d0);
        stream = (Log *)&that;
        operator<<(stream,(String *)local_4068);
        Log::addStringStream<int>((Log *)(local_4058 + 8),(int)stream);
        __fd = (int)stream;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4048);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4068 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var1 = &local_4078;
        goto LAB_00164fba;
      }
      pSVar6 = client;
      std::function<void_(const_std::shared_ptr<SocketClient>_&,_Message::MessageError_&&)>::
      operator()(&this->mErrorHandler,client,&error);
      __fd = (int)pSVar6;
    }
    else {
      std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
                (this_01,(__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      if ((message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mMessageId ==
          '\x02') {
        std::static_pointer_cast<FinishMessage,Message>((shared_ptr<Message> *)&local_40d0);
        this->mFinishStatus =
             *(int *)((long)local_40d0.mData.
                            super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x50)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Signal<std::function<void(std::shared_ptr<Connection>,int)>>::operator()
                  (&this->mFinished,(shared_ptr<Connection> *)this_01,&this->mFinishStatus);
        __fd = (int)this_01;
      }
      else {
        __fd = (int)&message;
        Signal<std::function<void(std::shared_ptr<Message>,std::shared_ptr<Connection>)>>::
        operator()(&this->mNewMessage,&message,(shared_ptr<Connection> *)this_01);
      }
      p_Var1 = &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>;
LAB_00164fba:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    }
    if (message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      SocketClient::close((client->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,__fd);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&error.text);
    StackBuffer<16384UL,_char>::~StackBuffer(&buffer);
  } while( true );
}

Assistant:

void Connection::onDataAvailable(const SocketClient::SharedPtr &client, Buffer&& buf)
{
    while (true) {
        if (!buf.isEmpty())
            mBuffers.push(std::forward<Buffer>(buf));

        unsigned int available = mBuffers.size();
        if (!available)
            break;
        if (!mPendingRead) {
            if (available < static_cast<int>(sizeof(uint32_t)))
                break;
            union {
                unsigned char b[sizeof(uint32_t)];
                int pending;
            };
            const int read = mBuffers.read(b, 4);
            assert(read == 4);
            mPendingRead = pending;
            assert(mPendingRead > 0);
            available -= read;
        }
        assert(mPendingRead >= 0);
        if (available < static_cast<unsigned int>(mPendingRead))
            break;

        StackBuffer<1024 * 16> buffer(mPendingRead);
        const int read = mBuffers.read(buffer.buffer(), mPendingRead);
        assert(read == mPendingRead);
        mPendingRead = 0;
        Message::MessageError error;
        std::shared_ptr<Message> message = Message::create(mVersion, buffer, read, &error);
        if (message) {
            auto that = shared_from_this();
            if (message->messageId() == FinishMessage::MessageId) {
                mFinishStatus = std::static_pointer_cast<FinishMessage>(message)->status();
                mFinished(that, mFinishStatus);
            } else {
                newMessage()(message, that);
            }
        } else if (mErrorHandler) {
            mErrorHandler(client, std::move(error));
        } else {
            ::error() << "Unable to create message from data" << error.type << error.text << read;
        }
        if (!message)
            client->close();
    }
}